

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O0

string * ArrVarName(Doublet *dbra,string *ketstr,string *prefix)

{
  long lVar1;
  string *in_RDI;
  string str;
  string tag;
  Gaussian *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char (*in_stack_ffffffffffffffa8) [6];
  allocator local_41;
  char (*in_stack_ffffffffffffffc0) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   in_stack_ffffffffffffff50);
  }
  Gaussian::am(in_stack_ffffffffffffff30);
  Gaussian::am(in_stack_ffffffffffffff30);
  StringBuilder<char[6],std::__cxx11::string&,char_const&,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffc8);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::string(in_RDI,(string *)&stack0xffffffffffffff88);
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return in_RDI;
}

Assistant:

inline std::string ArrVarName(Doublet dbra, const std::string & ketstr, const std::string & prefix = "")
{
    std::string tag = (dbra.tag.size() ? dbra.tag + "_" : "");
    std::string str = StringBuilder("INT__" , tag, amchar[dbra.left.am()],
                                    "_", amchar[dbra.right.am()], "_", ketstr);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}